

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

void st__free_table(st__table *table)

{
  st__table_entry *psVar1;
  int local_24;
  int i;
  st__table_entry *next;
  st__table_entry *ptr;
  st__table *table_local;
  
  for (local_24 = 0; local_24 < table->num_bins; local_24 = local_24 + 1) {
    psVar1 = table->bins[local_24];
    while (next = psVar1, next != (st__table_entry *)0x0) {
      psVar1 = next->next;
      if (next != (st__table_entry *)0x0) {
        free(next);
      }
    }
  }
  if (table->bins != (st__table_entry **)0x0) {
    free(table->bins);
    table->bins = (st__table_entry **)0x0;
  }
  if (table != (st__table *)0x0) {
    free(table);
  }
  return;
}

Assistant:

void
 st__free_table( st__table *table)
{
    st__table_entry *ptr, *next;
    int i;

    for(i = 0; i < table->num_bins ; i++) {
    ptr = table->bins[i];
    while (ptr != NULL) {
        next = ptr->next;
        ABC_FREE(ptr);
        ptr = next;
    }
    }
    ABC_FREE(table->bins);
    ABC_FREE(table);
}